

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O2

void av1_dist_wtd_convolve_2d_c
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int subpel_y_qn,ConvolveParams *conv_params)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  int16_t *piVar4;
  CONV_BUF_TYPE *pCVar5;
  byte bVar6;
  long lVar7;
  byte bVar8;
  byte bVar9;
  int iVar10;
  int k;
  int iVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  short *psVar17;
  long lVar18;
  uint uVar19;
  short *psVar20;
  short *psVar21;
  int k_1;
  uint uVar22;
  uint8_t uVar23;
  ulong uVar24;
  int x;
  ulong uVar25;
  ulong uVar26;
  short asStack_8b38 [17796];
  
  uVar1 = filter_params_y->taps;
  iVar11 = (uVar1 >> 1) - 1;
  uVar2 = filter_params_x->taps;
  piVar4 = filter_params_x->filter_ptr;
  iVar16 = conv_params->round_1;
  bVar6 = (byte)conv_params->round_0;
  uVar24 = 0;
  uVar26 = 0;
  if (0 < w) {
    uVar26 = (ulong)(uint)w;
  }
  uVar19 = (h + (uint)uVar1) - 1;
  uVar14 = (ulong)uVar19;
  if ((int)uVar19 < 1) {
    uVar14 = uVar24;
  }
  iVar12 = 1 - (uint)(uVar2 >> 1);
  lVar18 = (long)w;
  pCVar5 = conv_params->dst;
  iVar3 = conv_params->dst_stride;
  for (; uVar24 != uVar14; uVar24 = uVar24 + 1) {
    iVar10 = iVar12;
    for (uVar25 = 0; uVar25 != uVar26; uVar25 = uVar25 + 1) {
      iVar15 = 0x4000;
      for (uVar13 = 0; uVar2 != uVar13; uVar13 = uVar13 + 1) {
        iVar15 = iVar15 + (uint)src[uVar13 + ((long)iVar10 - (long)(iVar11 * src_stride))] *
                          (int)*(short *)((long)piVar4 +
                                         uVar13 * 2 +
                                         (ulong)((subpel_x_qn & 0xfU) * (uint)uVar2 * 2));
      }
      asStack_8b38[uVar24 * lVar18 + uVar25] =
           (short)(iVar15 + ((1 << (bVar6 & 0x1f)) >> 1) >> (bVar6 & 0x1f));
      iVar10 = iVar10 + 1;
    }
    iVar12 = iVar12 + src_stride;
  }
  bVar8 = 0xe - ((char)iVar16 + bVar6);
  piVar4 = filter_params_y->filter_ptr;
  uVar24 = (ulong)(uint)h;
  if (h < 1) {
    uVar24 = 0;
  }
  psVar20 = asStack_8b38 + (1 - (ulong)(uVar1 >> 1)) * lVar18 + (long)(iVar11 * w);
  for (uVar14 = 0; uVar14 != uVar24; uVar14 = uVar14 + 1) {
    lVar7 = uVar14 * (long)iVar3;
    psVar21 = psVar20;
    for (uVar25 = 0; uVar25 != uVar26; uVar25 = uVar25 + 1) {
      psVar17 = psVar21;
      iVar16 = 1 << (0x16 - bVar6 & 0x1f);
      for (uVar13 = 0; filter_params_y->taps != uVar13; uVar13 = uVar13 + 1) {
        iVar16 = iVar16 + (int)*psVar17 *
                          (int)*(short *)((long)piVar4 +
                                         uVar13 * 2 +
                                         (ulong)((subpel_y_qn & 0xfU) * (uint)uVar1 * 2));
        psVar17 = psVar17 + lVar18;
      }
      bVar9 = (byte)conv_params->round_1;
      uVar19 = ((1 << (bVar9 & 0x1f)) >> 1) + iVar16 >> (bVar9 & 0x1f);
      if (conv_params->do_average == 0) {
        pCVar5[lVar7 + uVar25] = (CONV_BUF_TYPE)uVar19;
      }
      else {
        uVar22 = (uint)pCVar5[lVar7 + uVar25];
        if (conv_params->use_dist_wtd_comp_avg == 0) {
          uVar19 = (uVar19 & 0xffff) + uVar22 >> 1;
        }
        else {
          uVar19 = (int)((uVar19 & 0xffff) * conv_params->bck_offset +
                        uVar22 * conv_params->fwd_offset) >> 4;
        }
        bVar9 = (0x16 - bVar6) - bVar9;
        iVar16 = (int)((-1 << (bVar9 - 1 & 0x1f)) +
                       (-1 << (bVar9 & 0x1f)) + ((1 << (bVar8 & 0x1f)) >> 1) + uVar19) >>
                 (bVar8 & 0x1f);
        if (iVar16 < 1) {
          iVar16 = 0;
        }
        uVar23 = (uint8_t)iVar16;
        if (0xfe < iVar16) {
          uVar23 = 0xff;
        }
        dst[uVar25 + uVar14 * (long)dst_stride] = uVar23;
      }
      psVar21 = psVar21 + 1;
    }
    psVar20 = psVar20 + lVar18;
  }
  return;
}

Assistant:

void av1_dist_wtd_convolve_2d_c(const uint8_t *src, int src_stride,
                                uint8_t *dst, int dst_stride, int w, int h,
                                const InterpFilterParams *filter_params_x,
                                const InterpFilterParams *filter_params_y,
                                const int subpel_x_qn, const int subpel_y_qn,
                                ConvolveParams *conv_params) {
  CONV_BUF_TYPE *dst16 = conv_params->dst;
  int dst16_stride = conv_params->dst_stride;
  int16_t im_block[(MAX_SB_SIZE + MAX_FILTER_TAP - 1) * MAX_SB_SIZE];
  int im_h = h + filter_params_y->taps - 1;
  int im_stride = w;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const int bd = 8;
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;

  // horizontal filter
  const uint8_t *src_horiz = src - fo_vert * src_stride;
  const int16_t *x_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_x, subpel_x_qn & SUBPEL_MASK);
  for (int y = 0; y < im_h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t sum = (1 << (bd + FILTER_BITS - 1));
      for (int k = 0; k < filter_params_x->taps; ++k) {
        sum += x_filter[k] * src_horiz[y * src_stride + x - fo_horiz + k];
      }
      assert(filter_params_x->taps > 8 ||
             (0 <= sum && sum < (1 << (bd + FILTER_BITS + 1))));
      im_block[y * im_stride + x] =
          (int16_t)ROUND_POWER_OF_TWO(sum, conv_params->round_0);
    }
  }

  // vertical filter
  int16_t *src_vert = im_block + fo_vert * im_stride;
  const int16_t *y_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_y, subpel_y_qn & SUBPEL_MASK);
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t sum = 1 << offset_bits;
      for (int k = 0; k < filter_params_y->taps; ++k) {
        sum += y_filter[k] * src_vert[(y - fo_vert + k) * im_stride + x];
      }
      assert(filter_params_y->taps > 8 ||
             (0 <= sum && sum < (1 << (offset_bits + 2))));
      CONV_BUF_TYPE res = ROUND_POWER_OF_TWO(sum, conv_params->round_1);
      if (conv_params->do_average) {
        int32_t tmp = dst16[y * dst16_stride + x];
        if (conv_params->use_dist_wtd_comp_avg) {
          tmp = tmp * conv_params->fwd_offset + res * conv_params->bck_offset;
          tmp = tmp >> DIST_PRECISION_BITS;
        } else {
          tmp += res;
          tmp = tmp >> 1;
        }
        tmp -= (1 << (offset_bits - conv_params->round_1)) +
               (1 << (offset_bits - conv_params->round_1 - 1));
        dst[y * dst_stride + x] =
            clip_pixel(ROUND_POWER_OF_TWO(tmp, round_bits));
      } else {
        dst16[y * dst16_stride + x] = res;
      }
    }
  }
}